

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * Catch::clara::detail::convertInto<double>(string *source,double *target)

{
  byte bVar1;
  double *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ParserResult *in_RDI;
  long in_FS_OFFSET;
  stringstream ss;
  string *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  ParserResult *__lhs;
  string local_1d0 [32];
  string local_1b0 [32];
  stringstream local_190 [16];
  ostream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  ::std::__cxx11::stringstream::stringstream(local_190);
  ::std::operator<<(local_180,(string *)in_RSI);
  ::std::istream::operator>>((istream *)local_190,in_RDX);
  bVar1 = ::std::ios::fail();
  if ((bVar1 & 1) == 0) {
    BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
              ((ParseResultType *)in_stack_fffffffffffffdd8);
  }
  else {
    ::std::operator+((char *)__lhs,in_RSI);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar1,in_stack_fffffffffffffde8),in_stack_fffffffffffffde0);
    BasicResult<Catch::clara::detail::ParseResultType>::runtimeError(in_stack_fffffffffffffdd8);
    ::std::__cxx11::string::~string(local_1b0);
    ::std::__cxx11::string::~string(local_1d0);
  }
  ::std::__cxx11::stringstream::~stringstream(local_190);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline auto convertInto( std::string const &source, T& target ) -> ParserResult {
        std::stringstream ss;
        ss << source;
        ss >> target;
        if( ss.fail() )
            return ParserResult::runtimeError( "Unable to convert '" + source + "' to destination type" );
        else
            return ParserResult::ok( ParseResultType::Matched );
    }